

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O0

void __thiscall OpenMD::KirkwoodBuff::processHistograms(KirkwoodBuff *this)

{
  SnapshotManager *this_00;
  size_type sVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  reference pvVar4;
  reference this_01;
  reference pvVar5;
  long in_RDI;
  RealType RVar6;
  __type _Var7;
  double dVar8;
  RealType nIdeal;
  RealType pairDensity;
  RealType volSlice;
  RealType rUpper;
  RealType rLower;
  size_t j;
  size_t i;
  RealType volume;
  vector<int,_std::allocator<int>_> nPairs;
  MultiComponentRDF *in_stack_ffffffffffffff48;
  int iVar9;
  Snapshot *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  vector<int,_std::allocator<int>_> *local_48;
  ulong local_40;
  vector<int,_std::allocator<int>_> local_20;
  
  MultiComponentRDF::getNPairs(in_stack_ffffffffffffff48);
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  SnapshotManager::getCurrentSnapshot(this_00);
  RVar6 = Snapshot::getVolume(in_stack_ffffffffffffff50);
  *(double *)(in_RDI + 0xfd8) = RVar6 + *(double *)(in_RDI + 0xfd8);
  local_40 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0xfe0));
    if (sVar1 <= local_40) break;
    local_48 = (vector<int,_std::allocator<int>_> *)0x0;
    while( true ) {
      in_stack_ffffffffffffff60 = local_48;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xfe0),local_40);
      pvVar3 = (vector<int,_std::allocator<int>_> *)
               std::vector<int,_std::allocator<int>_>::size(pvVar2);
      iVar9 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      if (pvVar3 <= in_stack_ffffffffffffff60) break;
      _Var7 = std::pow<double,int>((double)in_stack_ffffffffffffff50,iVar9);
      in_stack_ffffffffffffff50 =
           (Snapshot *)std::pow<double,int>((double)in_stack_ffffffffffffff50,iVar9);
      dVar8 = _Var7 - (double)in_stack_ffffffffffffff50;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,local_40);
      iVar9 = *pvVar4;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xfe0),local_40);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(size_type)local_48);
      in_stack_ffffffffffffff48 =
           (MultiComponentRDF *)
           ((double)*pvVar4 / (((dVar8 * 12.566370614359172) / 3.0) * ((double)iVar9 / RVar6)));
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)(in_RDI + 0xff8),local_40);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(size_type)local_48)
      ;
      *pvVar5 = (double)in_stack_ffffffffffffff48 + *pvVar5;
      local_48 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    local_40 = local_40 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void KirkwoodBuff::processHistograms() {
    std::vector<int> nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();

    meanVol_ += volume;

    for (std::size_t i {}; i < histograms_.size(); ++i) {
      for (std::size_t j {}; j < histograms_[i].size(); ++j) {
        RealType rLower   = j * deltaR_;
        RealType rUpper   = rLower + deltaR_;
        RealType volSlice = 4.0 * Constants::PI *
                            (std::pow(rUpper, 3) - std::pow(rLower, 3)) / 3.0;
        RealType pairDensity = nPairs[i] / volume;
        RealType nIdeal      = volSlice * pairDensity;

        gofrs_[i][j] += histograms_[i][j] / nIdeal;
      }
    }
  }